

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow_p.h
# Opt level: O2

void __thiscall
QMdi::ControlElement<QMdi::ControllerWidget>::ControlElement
          (ControlElement<QMdi::ControllerWidget> *this,QMdiSubWindow *child)

{
  ControllerWidget::ControllerWidget(&this->super_ControllerWidget,(QWidget *)0x0);
  *(undefined ***)&(this->super_ControllerWidget).super_QWidget = &PTR_metaObject_007d0868;
  *(undefined ***)&(this->super_ControllerWidget).super_QWidget.super_QPaintDevice =
       &PTR__ControlElement_007d0a18;
  (this->mdiChild).wp.d = (Data *)0x0;
  (this->mdiChild).wp.value = (QObject *)0x0;
  QWeakPointer<QObject>::assign<QObject>(&(this->mdiChild).wp,(QObject *)child);
  return;
}

Assistant:

ControlElement(QMdiSubWindow *child) : T(nullptr)
    {
        Q_ASSERT(child);
        mdiChild = child;
    }